

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpTcpEventLoopThreadPool::start(KcpTcpEventLoopThreadPool *this,ThreadInitCallback *cb)

{
  int iVar1;
  InetAddress m_udpLisetenAddr;
  bool bVar2;
  size_type sVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  const_reference pvVar7;
  KcpTcpEventLoopThread *this_00;
  KcpTcpEventLoop *local_1460;
  unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>
  local_1458;
  undefined1 local_144a;
  allocator local_1449;
  string local_1448 [32];
  KcpTcpEventLoopThread *pKStack_1428;
  undefined4 uStack_1420;
  uint32_t local_141c;
  undefined4 uStack_1418;
  undefined8 uStack_1414;
  KcpTcpEventLoopThread *local_1400;
  KcpTcpEventLoopThread *t;
  InetAddress addr;
  allocator_type local_13d1;
  int i;
  vector<char,_std::allocator<char>_> vbuf;
  result_type_conflict local_13a4;
  undefined1 local_13a0 [4];
  int initSeed;
  random_device rd;
  ThreadInitCallback *cb_local;
  KcpTcpEventLoopThreadPool *this_local;
  
  rd.field_0._M_mt._M_p = (size_t)cb;
  if (((this->m_started ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                  ,0x1f,
                  "void sznet::net::KcpTcpEventLoopThreadPool::start(const ThreadInitCallback &)");
  }
  iVar1 = this->m_numThreads;
  sVar3 = std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::size
                    (&this->m_udpListenAddrs);
  if ((long)iVar1 != sVar3) {
    __assert_fail("m_numThreads == m_udpListenAddrs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                  ,0x20,
                  "void sznet::net::KcpTcpEventLoopThreadPool::start(const ThreadInitCallback &)");
  }
  EventLoop::assertInLoopThread(&this->m_baseLoop->super_EventLoop);
  this->m_started = true;
  std::random_device::random_device((random_device *)local_13a0);
  local_13a4 = std::random_device::operator()((random_device *)local_13a0);
  lVar4 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&i,lVar4 + 0x20,&local_13d1);
  std::allocator<char>::~allocator(&local_13d1);
  for (addr.field_0.m_addr6.sin6_scope_id = 0;
      (int)addr.field_0.m_addr6.sin6_scope_id < this->m_numThreads;
      addr.field_0.m_addr6.sin6_scope_id = addr.field_0.m_addr6.sin6_scope_id + 1) {
    pcVar5 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)&i);
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)&i);
    uVar6 = std::__cxx11::string::c_str();
    snprintf(pcVar5,sVar3,"%s%d",uVar6,(ulong)addr.field_0.m_addr6.sin6_scope_id);
    pvVar7 = std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::
             operator[](&this->m_udpListenAddrs,(long)(int)addr.field_0.m_addr6.sin6_scope_id);
    t = *(KcpTcpEventLoopThread **)&pvVar7->field_0;
    uVar6 = *(undefined8 *)((long)&pvVar7->field_0 + 8);
    addr.field_0._12_8_ = *(undefined8 *)((long)&pvVar7->field_0 + 0x14);
    addr.field_0._8_4_ = (undefined4)((ulong)*(undefined8 *)((long)&pvVar7->field_0 + 0xc) >> 0x20);
    addr.field_0._0_4_ = (undefined4)uVar6;
    addr.field_0.m_addr6.sin6_flowinfo = (uint32_t)((ulong)uVar6 >> 0x20);
    local_13a4 = local_13a4 + addr.field_0.m_addr6.sin6_scope_id;
    this_00 = (KcpTcpEventLoopThread *)operator_new(0x1b0);
    uVar6 = rd.field_0._M_mt._M_p;
    local_144a = 1;
    uStack_1418 = addr.field_0._8_4_;
    uStack_1414 = addr.field_0._12_8_;
    pKStack_1428 = t;
    uStack_1420 = addr.field_0._0_4_;
    local_141c = addr.field_0.m_addr6.sin6_flowinfo;
    pcVar5 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)&i);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1448,pcVar5,&local_1449);
    m_udpLisetenAddr.field_0._8_4_ = uStack_1420;
    m_udpLisetenAddr.field_0._0_8_ = pKStack_1428;
    m_udpLisetenAddr.field_0._12_4_ = local_141c;
    m_udpLisetenAddr.field_0._16_4_ = uStack_1418;
    m_udpLisetenAddr.field_0._20_8_ = uStack_1414;
    KcpTcpEventLoopThread::KcpTcpEventLoopThread
              (this_00,m_udpLisetenAddr,(ThreadInitCallback *)uVar6,(string *)local_1448,local_13a4)
    ;
    local_144a = 0;
    std::__cxx11::string::~string(local_1448);
    std::allocator<char>::~allocator((allocator<char> *)&local_1449);
    local_1400 = this_00;
    std::
    unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>
    ::unique_ptr<std::default_delete<sznet::net::KcpTcpEventLoopThread>,void>
              ((unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>
                *)&local_1458,this_00);
    std::
    vector<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>,_std::allocator<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>_>_>
    ::push_back(&this->m_threads,(value_type *)&local_1458);
    std::
    unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>
    ::~unique_ptr(&local_1458);
    local_1460 = KcpTcpEventLoopThread::startLoop(local_1400);
    std::vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>::
    push_back(&this->m_loops,&local_1460);
  }
  if ((this->m_numThreads == 0) &&
     (bVar2 = std::function::operator_cast_to_bool((function *)rd.field_0._M_mt._M_p), bVar2)) {
    std::function<void_(sznet::net::KcpTcpEventLoop_*)>::operator()
              ((function<void_(sznet::net::KcpTcpEventLoop_*)> *)rd.field_0._M_mt._M_p,
               this->m_baseLoop);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&i);
  std::random_device::~random_device((random_device *)local_13a0);
  return;
}

Assistant:

void KcpTcpEventLoopThreadPool::start(const ThreadInitCallback& cb)
{
	assert(!m_started);
	assert(m_numThreads == m_udpListenAddrs.size()),
		m_baseLoop->assertInLoopThread();
	m_started = true;
	std::random_device rd;
	int initSeed = rd();

	std::vector<char> vbuf(m_name.size() + 32);
	for (int i = 0; i < m_numThreads; ++i)
	{
		snprintf(vbuf.data(), vbuf.size(), "%s%d", m_name.c_str(), i);
		InetAddress addr = m_udpListenAddrs[i];
		initSeed = initSeed + i;
		KcpTcpEventLoopThread* t = new KcpTcpEventLoopThread(addr, cb, vbuf.data(), initSeed);
		m_threads.push_back(std::unique_ptr<KcpTcpEventLoopThread>(t));
		// 阻塞
		// 启动EventLoopThread线程，在进入事件循环之前，会调用cb
		m_loops.push_back(t->startLoop());
	}
	// 只有一个EventLoop，在这个EventLoop进入事件循环之前，调用cb
	if (m_numThreads == 0 && cb)
	{
		cb(m_baseLoop);
	}
}